

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeDValue cellMargin(Rtree *pRtree,RtreeCell *p)

{
  double local_40;
  double local_30;
  int local_24;
  double dStack_20;
  int ii;
  RtreeDValue margin;
  RtreeCell *p_local;
  Rtree *pRtree_local;
  
  dStack_20 = 0.0;
  local_24 = pRtree->nDim2 - 2;
  do {
    if (pRtree->eCoordType == '\0') {
      local_30 = (double)p->aCoord[local_24 + 1].f;
    }
    else {
      local_30 = (double)p->aCoord[local_24 + 1].i;
    }
    if (pRtree->eCoordType == '\0') {
      local_40 = (double)p->aCoord[local_24].f;
    }
    else {
      local_40 = (double)p->aCoord[local_24].i;
    }
    dStack_20 = (local_30 - local_40) + dStack_20;
    local_24 = local_24 + -2;
  } while (-1 < local_24);
  return dStack_20;
}

Assistant:

static RtreeDValue cellMargin(Rtree *pRtree, RtreeCell *p){
  RtreeDValue margin = 0;
  int ii = pRtree->nDim2 - 2;
  do{
    margin += (DCOORD(p->aCoord[ii+1]) - DCOORD(p->aCoord[ii]));
    ii -= 2;
  }while( ii>=0 );
  return margin;
}